

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quoting.cpp
# Opt level: O3

pair<std::shared_ptr<SchemeObject>,_bool> *
do_quote(pair<std::shared_ptr<SchemeObject>,_bool> *__return_storage_ptr__,shared_ptr<ASTNode> *node
        ,Context *context,int quasi_level)

{
  _Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_> this;
  ASTNode *this_00;
  int *piVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  _Node *p_Var12;
  element_type *peVar13;
  runtime_error *prVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  _List_node_base *p_Var15;
  _Head_base<0UL,_TailContext_*,_false> _Var16;
  shared_ptr<ASTNode> *psVar17;
  pair<std::shared_ptr<SchemeObject>,_bool> quoted;
  bool dotted;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> to_insert;
  shared_ptr<SchemePair> lst;
  int local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  undefined1 local_a8 [24];
  _Head_base<0UL,_TailContext_*,_false> _Stack_90;
  long local_88;
  shared_ptr<ASTNode> *local_78;
  shared_ptr<SchemeObject> local_70;
  Context *local_60;
  pair<std::shared_ptr<SchemeObject>,_bool> *local_58;
  shared_ptr<SchemePair> local_50;
  shared_ptr<ASTNode> local_40;
  
  this_00 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_00->type - INT < 5) {
    ASTNode::evaluate((ExecutionResult *)local_c8,this_00,context);
    ExecutionResult::force_value((ExecutionResult *)(local_a8 + 0x10));
    _Var16._M_head_impl = _Stack_90._M_head_impl;
    _Stack_90._M_head_impl = (TailContext *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_a8._16_8_;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var16._M_head_impl;
    local_a8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->second = false;
    if ((_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)local_b0._M_p !=
        (TailContext *)0x0) {
      std::default_delete<TailContext>::operator()
                ((default_delete<TailContext> *)&local_b0,(TailContext *)local_b0._M_p);
    }
    local_b0._M_p = (pointer)0x0;
    local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_b8._1_7_,local_b8[0]);
    goto LAB_00136ef6;
  }
  if (this_00->type == NAME) {
    local_c8._0_8_ = (SchemeSymbol *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SchemeSymbol,std::allocator<SchemeSymbol>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),
               (SchemeSymbol **)local_c8,(allocator<SchemeSymbol> *)(local_a8 + 0x10),
               &this_00->value);
    uVar8 = local_c8._8_8_;
    uVar7 = local_c8._0_8_;
    local_c8._0_8_ = (SchemeSymbol *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar7;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __return_storage_ptr__->second = false;
      return __return_storage_ptr__;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar8 + 8) = *(_Atomic_word *)(uVar8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar8 + 8) = *(_Atomic_word *)(uVar8 + 8) + 1;
    }
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar7;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    __return_storage_ptr__->second = false;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
    local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
    goto LAB_00136ef6;
  }
  std::dynamic_pointer_cast<SchemePair,SchemeObject>(&local_70);
  peVar13 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_cc = quasi_level;
  local_78 = node;
  local_58 = __return_storage_ptr__;
  if (((0 < quasi_level) &&
      ((peVar13->list).
       super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
       _M_impl._M_node._M_size != 0)) &&
     (piVar1 = *(int **)((long)(peVar13->list).
                               super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next + 0x10), *piVar1 == 1)
     ) {
    local_c8._0_8_ = (SchemeSymbol *)local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,*(long *)(piVar1 + 2),
               *(long *)(piVar1 + 4) + *(long *)(piVar1 + 2));
    iVar9 = std::__cxx11::string::compare(local_c8);
    if (iVar9 == 0) {
      if (quasi_level == 1) {
        peVar13 = (local_78->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar13->list).
            super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
            _M_impl._M_node._M_size != 2) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar14,"unquote: one argument required");
LAB_00137562:
          *(undefined ***)prVar14 = &PTR__runtime_error_0016b300;
          __cxa_throw(prVar14,&eval_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ASTNode::evaluate((ExecutionResult *)(local_a8 + 0x10),
                          (ASTNode *)
                          (*(_List_node_base **)
                            ((long)&(peVar13->list).
                                    super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                                    ._M_impl._M_node.super__List_node_base + 8))[1]._M_next,context)
        ;
        ExecutionResult::force_value((ExecutionResult *)local_a8);
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_a8._0_8_;
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
        __return_storage_ptr__->second = false;
        goto LAB_00137460;
      }
LAB_00137471:
      local_cc = quasi_level + -1;
LAB_00137473:
      bVar6 = true;
    }
    else {
      iVar9 = std::__cxx11::string::compare(local_c8);
      if (iVar9 != 0) {
        iVar9 = std::__cxx11::string::compare(local_c8);
        local_cc = quasi_level + (uint)(iVar9 == 0);
        goto LAB_00137473;
      }
      if (quasi_level != 1) goto LAB_00137471;
      peVar13 = (local_78->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar13->list).
          super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
          _M_impl._M_node._M_size != 2) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar14,"unquote-splicing: one argument required");
        goto LAB_00137562;
      }
      ASTNode::evaluate((ExecutionResult *)(local_a8 + 0x10),
                        (ASTNode *)
                        (*(_List_node_base **)
                          ((long)&(peVar13->list).
                                  super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                                  ._M_impl._M_node.super__List_node_base + 8))[1]._M_next,context);
      ExecutionResult::force_value((ExecutionResult *)local_a8);
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a8._0_8_;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
      __return_storage_ptr__->second = true;
LAB_00137460:
      local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a8._0_8_ = (element_type *)0x0;
      bVar6 = false;
      ExecutionResult::~ExecutionResult((ExecutionResult *)(local_a8 + 0x10));
      local_cc = 1;
    }
    if ((SchemeSymbol *)local_c8._0_8_ != (SchemeSymbol *)local_b8) {
      operator_delete((void *)local_c8._0_8_,CONCAT71(local_b8._1_7_,local_b8[0]) + 1);
    }
    if (!bVar6) goto LAB_00136ef6;
    peVar13 = (local_78->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
  p_Var15 = (_List_node_base *)&peVar13->list;
  if (p_Var15 !=
      (peVar13->list).
      super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>._M_impl
      ._M_node.super__List_node_base._M_next) {
    iVar9 = 0;
    this.super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
         (_Head_base<0UL,_TailContext_*,_false>)((long)local_a8 + 0x10);
    psVar17 = local_78;
    local_60 = context;
    do {
      local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var15->_M_prev[1]._M_next;
      local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15->_M_prev[1]._M_prev;
      if (local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      do_quote((pair<std::shared_ptr<SchemeObject>,_bool> *)local_c8,&local_40,context,local_cc);
      if (local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_b8[0] == true) {
        local_88 = 0;
        context = local_60;
        local_a8._16_8_ = this.super__Head_base<0UL,_TailContext_*,_false>._M_head_impl;
        _Stack_90._M_head_impl =
             (TailContext *)this.super__Head_base<0UL,_TailContext_*,_false>._M_head_impl;
        if ((element_type *)local_c8._0_8_ !=
            scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          do {
            if (((SchemeSymbol *)local_c8._0_8_ == (SchemeSymbol *)0x0) ||
               (lVar11 = __dynamic_cast(local_c8._0_8_,&SchemeObject::typeinfo,&SchemePair::typeinfo
                                        ,0), uVar7 = local_c8._8_8_, lVar11 == 0)) {
              prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar14,"unquote-slicing: the expression did not evaluate to a list");
              *(undefined ***)prVar14 = &PTR__runtime_error_0016b300;
              __cxa_throw(prVar14,&eval_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
              }
            }
            p_Var12 = std::__cxx11::
                      list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>
                      ::_M_create_node<std::shared_ptr<SchemeObject>const&>
                                ((list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>
                                  *)this.super__Head_base<0UL,_TailContext_*,_false>._M_head_impl,
                                 (shared_ptr<SchemeObject> *)(lVar11 + 8));
            std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
            local_88 = local_88 + 1;
            local_c8._0_8_ = *(undefined8 *)(lVar11 + 0x18);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar11 + 0x20));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
            }
            context = local_60;
          } while ((element_type *)local_c8._0_8_ !=
                   scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          _Var16._M_head_impl =
               (TailContext *)this.super__Head_base<0UL,_TailContext_*,_false>._M_head_impl;
          if (this.super__Head_base<0UL,_TailContext_*,_false>._M_head_impl !=
              (_Head_base<0UL,_TailContext_*,_false>)local_a8._16_8_) {
            do {
              prepend_value((shared_ptr<SchemePair> *)&local_70,
                            (shared_ptr<SchemeObject> *)
                            (((_Var16._M_head_impl)->func).
                             super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 1),(bool *)local_a8);
              iVar9 = iVar9 + 1;
              _Var16._M_head_impl =
                   (TailContext *)
                   ((_Var16._M_head_impl)->func).
                   super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ;
            } while (_Var16._M_head_impl != (TailContext *)local_a8._16_8_);
          }
        }
        std::__cxx11::
        _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
        _M_clear((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)this.super__Head_base<0UL,_TailContext_*,_false>._M_head_impl);
        psVar17 = local_78;
      }
      else {
        p_Var2 = p_Var15->_M_prev[1]._M_next;
        if ((*(int *)&p_Var2->_M_next == 1) &&
           (iVar10 = std::__cxx11::string::compare((char *)&p_Var2->_M_prev), iVar10 == 0)) {
          if (iVar9 != 1) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar14,"Invalid dotted sequence");
            *(undefined ***)prVar14 = &PTR__runtime_error_0016b300;
            __cxa_throw(prVar14,&eval_error::typeinfo,std::runtime_error::~runtime_error);
          }
          p_Var3 = (((shared_ptr<SchemeObject> *)
                    ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 8))->
                   super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          peVar4 = (((shared_ptr<SchemeObject> *)
                    ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 0x18))->
                   super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var5 = (((shared_ptr<SchemeObject> *)
                    ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 0x18))->
                   super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          (((shared_ptr<SchemeObject> *)
           ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0x18))->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (((shared_ptr<SchemeObject> *)
                ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 8))->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          (((shared_ptr<SchemeObject> *)
           ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0x18))->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
               p_Var3;
          (((shared_ptr<SchemeObject> *)
           ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))
          ->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
          (((shared_ptr<SchemeObject> *)
           ((long)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))
          ->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var5
          ;
          local_a8[0] = 1;
          iVar9 = 2;
        }
        else {
          prepend_value((shared_ptr<SchemePair> *)&local_70,(shared_ptr<SchemeObject> *)local_c8,
                        (bool *)local_a8);
          iVar9 = iVar9 + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      p_Var15 = p_Var15->_M_prev;
      peVar13 = (psVar17->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    } while (p_Var15 !=
             (peVar13->list).
             super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
             _M_impl._M_node.super__List_node_base._M_next);
  }
  __return_storage_ptr__ = local_58;
  if (peVar13->type == VECTOR) {
    local_50.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SchemeVector::from_list((SchemeVector *)local_c8,&local_50);
    uVar8 = local_c8._8_8_;
    uVar7 = local_c8._0_8_;
    local_c8._0_8_ = (SchemeSymbol *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar7;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __return_storage_ptr__->second = false;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(uVar8 + 8) = *(_Atomic_word *)(uVar8 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(uVar8 + 8) = *(_Atomic_word *)(uVar8 + 8) + 1;
      }
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar7;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
      __return_storage_ptr__->second = false;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
    }
    this_01._M_pi =
         local_50.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_50.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00136ef6;
  }
  else {
    if (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (local_58->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (local_58->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58->second = false;
      goto LAB_00136ef6;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_0013735d;
      LOCK();
      (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
LAB_0013735d:
      (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
    (local_58->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (local_58->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_58->second = false;
    this_01._M_pi =
         local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
LAB_00136ef6:
  if (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<SchemeObject>, bool>
do_quote(std::shared_ptr<ASTNode> node, const Context &context, int quasi_level)
{
    if(node->type == ast_type_t::STRING || node->type == ast_type_t::INT || node->type == ast_type_t::FLOAT ||
       node->type == ast_type_t::BOOL || node->type == ast_type_t::CHAR)
    {
        return {node->evaluate(context).force_value(), false};
    }
    if(node->type == ast_type_t::NAME)
    {
        return {to_object(std::make_shared<SchemeSymbol>(node->value)), false};
    }
    auto lst = std::dynamic_pointer_cast<SchemePair>(scheme_nil);
    if(quasi_level > 0 && node->list.size() && node->list.front()->type == ast_type_t::NAME)
    {
        auto head = node->list.front()->value;
        if(head == "unquote")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote: one argument required");
                return {node->list.back()->evaluate(context).force_value(), false};
            }
            --quasi_level;
        }
        else if(head == "unquote-splicing")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote-splicing: one argument required");
                return {node->list.back()->evaluate(context).force_value(), true};
            }
            --quasi_level;
        }
        else if(head == "quasiquote")
            ++quasi_level;
    }
    int taken = 0;
    bool dotted = false;
    for(auto i = node->list.rbegin(); i != node->list.rend(); ++i)
    {
        auto quoted = do_quote(*i, context, quasi_level);
        if(quoted.second)
        {
            std::list<std::shared_ptr<SchemeObject>> to_insert;
            while(quoted.first != scheme_nil)
            {
                auto sublst = std::dynamic_pointer_cast<SchemePair>(quoted.first);
                if(!sublst)
                    throw eval_error("unquote-slicing: the expression did not evaluate to a list");
                to_insert.push_back(sublst->car);
                quoted.first = sublst->cdr;
            }
            for(auto j = to_insert.rbegin(); j != to_insert.rend(); ++j)
            {
                prepend_value(lst, *j, dotted);
                ++taken;
            }
        }
        else if((*i)->type == ast_type_t::NAME && (*i)->value == ".")
        {
            if(taken != 1)
                throw eval_error("Invalid dotted sequence");
            std::swap(lst->car, lst->cdr);
            dotted = true;
            ++taken;
        }
        else
        {
            prepend_value(lst, quoted.first, dotted);
            ++taken;
        }
    }
    if(node->type == ast_type_t::VECTOR)
        return {to_object(SchemeVector::from_list(lst)), false};
    return {to_object(lst), false};
}